

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void google::protobuf::internal::UnknownFieldSetSerializer
               (uint8 *base,uint32 offset,uint32 tag,uint32 has_offset,CodedOutputStream *output)

{
  uint8 *puVar1;
  
  if ((*(ulong *)(base + offset) & 1) != 0) {
    puVar1 = WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((*(ulong *)(base + offset) & 0xfffffffffffffffe) + 8),
                        output->cur_,&output->impl_);
    output->cur_ = puVar1;
  }
  return;
}

Assistant:

void UnknownFieldSetSerializer(const uint8* base, uint32 offset, uint32 tag,
                               uint32 has_offset,
                               io::CodedOutputStream* output) {
  const void* ptr = base + offset;
  const InternalMetadata* metadata = static_cast<const InternalMetadata*>(ptr);
  if (metadata->have_unknown_fields()) {
    internal::WireFormat::SerializeUnknownFields(
        metadata->unknown_fields<UnknownFieldSet>(
            UnknownFieldSet::default_instance),
        output);
  }
}